

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_time.cpp
# Opt level: O0

sc_time sc_core::sc_get_default_time_unit(void)

{
  value_type in_RDI;
  int in_stack_00000064;
  char *in_stack_00000068;
  char *in_stack_00000070;
  char *in_stack_00000078;
  sc_severity in_stack_00000084;
  value_type v;
  
  v = in_RDI;
  if (sc_get_default_time_unit::warn_get_default_time_unit) {
    sc_get_default_time_unit::warn_get_default_time_unit = false;
    sc_report_handler::report
              (in_stack_00000084,in_stack_00000078,in_stack_00000070,in_stack_00000068,
               in_stack_00000064);
  }
  sc_get_curr_simcontext();
  sc_time::from_value(v);
  return (sc_time)in_RDI;
}

Assistant:

sc_time
sc_get_default_time_unit()
{
    static bool warn_get_default_time_unit = true;
    if ( warn_get_default_time_unit )
    {
        warn_get_default_time_unit=false;
        SC_REPORT_INFO(SC_ID_IEEE_1666_DEPRECATION_,
            "deprecated function: sc_get_default_time_unit");
    }
    return sc_time::from_value(
              sc_get_curr_simcontext()->m_time_params->default_time_unit
           );
}